

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O0

RationalNum __thiscall RationalNum::operator-(RationalNum *this)

{
  int iVar1;
  RationalNum *this_local;
  RationalNum temp;
  
  RationalNum((RationalNum *)&this_local);
  iVar1 = getNumerator(this);
  setNumerator((RationalNum *)&this_local,(long)-iVar1);
  iVar1 = getDenominator(this);
  setDenominator((RationalNum *)&this_local,(long)iVar1);
  return _this_local;
}

Assistant:

RationalNum RationalNum::operator-() const {
    RationalNum temp;
    temp.setNumerator(-getNumerator());
    temp.setDenominator(getDenominator());
    return temp;
}